

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O1

int copy_source(zip_source_t *from,zip_source_t *to)

{
  int iVar1;
  long lVar2;
  long lVar3;
  zip_uint8_t buf [8192];
  undefined1 auStack_2028 [8200];
  
  iVar1 = zip_source_open();
  if (iVar1 < 0) {
    copy_source_cold_5();
  }
  else {
    iVar1 = zip_source_begin_write(to);
    if (iVar1 < 0) {
      copy_source_cold_4();
    }
    else {
      do {
        lVar2 = zip_source_read(from,auStack_2028,0x2000);
        if (lVar2 < 1) {
          if (lVar2 < 0) {
            copy_source_cold_2();
            return -1;
          }
          zip_source_close(from);
          iVar1 = zip_source_commit_write(to);
          if (iVar1 < 0) {
            copy_source_cold_1();
            return -1;
          }
          return 0;
        }
        lVar3 = zip_source_write(to,auStack_2028,lVar2);
      } while (lVar3 == lVar2);
      copy_source_cold_3();
    }
  }
  return -1;
}

Assistant:

static int
copy_source(zip_source_t *from, zip_source_t *to) {
    zip_uint8_t buf[8192];
    zip_int64_t n;

    if (zip_source_open(from) < 0) {
	fprintf(stderr, "%s: can't open source for reading: %s\n", progname, zip_error_strerror(zip_source_error(from)));
	return -1;
    }

    if (zip_source_begin_write(to) < 0) {
	fprintf(stderr, "%s: can't open source for writing: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	zip_source_close(from);
	return -1;
    }

    while ((n = zip_source_read(from, buf, sizeof(buf))) > 0) {
	if (zip_source_write(to, buf, (zip_uint64_t)n) != n) {
	    fprintf(stderr, "%s: can't write to source: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	    zip_source_close(from);
	    zip_source_rollback_write(to);
	    return -1;
	}
    }

    if (n < 0) {
	fprintf(stderr, "%s: can't read from source: %s\n", progname, zip_error_strerror(zip_source_error(from)));
	zip_source_close(from);
	zip_source_rollback_write(to);
	return -1;
    }

    zip_source_close(from);

    if (zip_source_commit_write(to) < 0) {
	fprintf(stderr, "%s: can't commit source: %s\n", progname, zip_error_strerror(zip_source_error(to)));
	zip_source_rollback_write(to);
	return -1;
    }

    return 0;
}